

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void disas_mulw(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 arg;
  TCGv_i32 ret;
  TCGv_i32 arg2;
  ea_what what;
  uintptr_t o;
  
  tcg_ctx = s->uc->tcg_ctx;
  arg = *(TCGv_i32 *)((long)tcg_ctx->cpu_dregs + (ulong)(insn >> 6 & 0x38));
  ret = tcg_temp_new_i32(tcg_ctx);
  if ((insn >> 8 & 1) == 0) {
    what = EA_LOADU;
    tcg_gen_ext16u_i32_m68k(tcg_ctx,ret,arg);
  }
  else {
    tcg_gen_ext16s_i32_m68k(tcg_ctx,ret,arg);
    what = EA_LOADS;
  }
  arg2 = gen_ea(env,s,insn,1,tcg_ctx->NULL_QREG,(TCGv_i32 *)0x0,what,
                (uint)((((s->base).tb)->flags >> 0xd & 1) == 0));
  if (arg2 != tcg_ctx->NULL_QREG) {
    tcg_gen_mul_i32(tcg_ctx,ret,ret,arg2);
    tcg_gen_mov_i32(tcg_ctx,arg,ret);
    gen_logic_cc(s,ret,2);
    tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
    return;
  }
  gen_addr_fault(s);
  return;
}

Assistant:

DISAS_INSN(mulw)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv reg;
    TCGv tmp;
    TCGv src;
    int sign;

    sign = (insn & 0x100) != 0;
    reg = DREG(insn, 9);
    tmp = tcg_temp_new(tcg_ctx);
    if (sign)
        tcg_gen_ext16s_i32(tcg_ctx, tmp, reg);
    else
        tcg_gen_ext16u_i32(tcg_ctx, tmp, reg);
    SRC_EA(env, src, OS_WORD, sign, NULL);
    tcg_gen_mul_i32(tcg_ctx, tmp, tmp, src);
    tcg_gen_mov_i32(tcg_ctx, reg, tmp);
    gen_logic_cc(s, tmp, OS_LONG);
    tcg_temp_free(tcg_ctx, tmp);
}